

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFileListGeneratorEnumerate::Search
          (cmFileListGeneratorEnumerate *this,string *parent,cmFileList *lister)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar2 = (this->Vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    __rhs = pbVar2;
    pbVar1 = (this->Vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs == pbVar1) break;
    std::operator+(&local_50,parent,__rhs);
    bVar3 = cmFileListGeneratorBase::Consider(&this->super_cmFileListGeneratorBase,&local_50,lister)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    pbVar2 = __rhs + 1;
  } while (!bVar3);
  return __rhs != pbVar1;
}

Assistant:

bool Search(std::string const& parent, cmFileList& lister) CM_OVERRIDE
  {
    for (std::vector<std::string>::const_iterator i = this->Vector.begin();
         i != this->Vector.end(); ++i) {
      if (this->Consider(parent + *i, lister)) {
        return true;
      }
    }
    return false;
  }